

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O0

void __thiscall
el::base::utils::RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>::
unregisterAll(RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate> *this)

{
  bool bVar1;
  ulong uVar2;
  __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  *in_RDI;
  HitCounter **curr;
  iterator __end0;
  iterator __begin0;
  vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *__range4;
  vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *in_stack_ffffffffffffffc8
  ;
  __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  local_18;
  undefined8 local_10;
  
  uVar2 = (*(code *)in_RDI->_M_current[9])();
  if ((uVar2 & 1) == 0) {
    local_10 = (*(code *)in_RDI->_M_current[0xb])();
    local_18._M_current =
         (HitCounter **)
         std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::begin
                   (in_stack_ffffffffffffffc8);
    std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::end
              (in_stack_ffffffffffffffc8);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (in_RDI,(__normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
                                 *)in_stack_ffffffffffffffc8);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
      ::operator*(&local_18);
      safeDelete<el::base::HitCounter>((HitCounter **)in_RDI);
      __gnu_cxx::
      __normal_iterator<el::base::HitCounter_**,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
      ::operator++(&local_18);
    }
    (*(code *)in_RDI->_M_current[0xb])();
    std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>::clear
              ((vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_> *)0x2828b8);
  }
  return;
}

Assistant:

virtual void unregisterAll(void) ELPP_FINAL {
    if (!this->empty()) {
      for (auto&& curr : this->list()) {
        base::utils::safeDelete(curr);
      }
      this->list().clear();
    }
  }